

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::ConstantDerivateCase::verify
          (ConstantDerivateCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  Vec4 *v;
  bool bVar1;
  undefined7 extraout_var;
  Vec4 reference;
  tcu local_60 [16];
  undefined1 local_50 [16];
  Vec4 threshold;
  
  tcu::Vector<float,_4>::Vector(&reference,0.0);
  TriangleDerivateCase::getSurfaceThreshold((TriangleDerivateCase *)local_50);
  v = &(this->super_TriangleDerivateCase).m_derivScale;
  tcu::abs<float,4>(local_60,v);
  tcu::operator/((tcu *)&threshold,(Vector<float,_4> *)local_50,(Vector<float,_4> *)local_60);
  bVar1 = verifyConstantDerivate
                    (((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx)->m_log,(ConstPixelBufferAccess *)ctx,
                     (PixelBufferAccess *)sig,(this->super_TriangleDerivateCase).m_dataType,
                     &reference,&threshold,v,&(this->super_TriangleDerivateCase).m_derivBias,LOG_ALL
                    );
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

bool ConstantDerivateCase::verify (const tcu::ConstPixelBufferAccess& result, const tcu::PixelBufferAccess& errorMask)
{
	const tcu::Vec4 reference	(0.0f); // Derivate of constant argument should always be 0
	const tcu::Vec4	threshold	= getSurfaceThreshold() / abs(m_derivScale);

	return verifyConstantDerivate(m_testCtx.getLog(), result, errorMask, m_dataType,
								  reference, threshold, m_derivScale, m_derivBias);
}